

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_add_flags_extension(CBB *cbb,SSLFlags flags)

{
  int iVar1;
  undefined1 local_80 [8];
  CBB child;
  CBB body;
  SSLFlags flags_local;
  CBB *cbb_local;
  
  if (flags == 0) {
    cbb_local._7_1_ = true;
  }
  else {
    iVar1 = CBB_add_u16(cbb,0x3e);
    if (((iVar1 == 0) ||
        (iVar1 = CBB_add_u16_length_prefixed(cbb,(CBB *)((long)&child.u + 0x18)), iVar1 == 0)) ||
       (iVar1 = CBB_add_u8_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)local_80),
       body.u._28_4_ = flags, iVar1 == 0)) {
      cbb_local._7_1_ = false;
    }
    else {
      for (; body.u._28_4_ != 0; body.u._28_4_ = (uint)body.u._28_4_ >> 8) {
        iVar1 = CBB_add_u8((CBB *)local_80,(uint8_t)body.u._28_4_);
        if (iVar1 == 0) {
          return false;
        }
      }
      iVar1 = CBB_flush(cbb);
      cbb_local._7_1_ = iVar1 != 0;
    }
  }
  return cbb_local._7_1_;
}

Assistant:

bool ssl_add_flags_extension(CBB *cbb, SSLFlags flags) {
  if (flags == 0) {
    return true;
  }

  CBB body, child;
  if (!CBB_add_u16(cbb, TLSEXT_TYPE_tls_flags) ||
      !CBB_add_u16_length_prefixed(cbb, &body) ||
      !CBB_add_u8_length_prefixed(&body, &child)) {
    return false;
  }

  while (flags != 0) {
    if (!CBB_add_u8(&child, static_cast<uint8_t>(flags))) {
      return false;
    }
    flags >>= 8;
  }

  return CBB_flush(cbb);
}